

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O2

int Llb_NonlinQuantify1(Llb_Mgr_t *p,Llb_Prt_t *pPart,int fSubset)

{
  DdNode *pDVar1;
  Vec_Int_t *p_00;
  Llb_Var_t *pVar;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  DdNode *pDVar7;
  DdNode *n;
  Vec_Ptr_t *p_01;
  Llb_Prt_t *pPart_00;
  long lVar8;
  int Length;
  
  if (fSubset == 0) {
    pDVar7 = Llb_NonlinCreateCube1(p,pPart);
    Cudd_Ref(pDVar7);
    pDVar1 = pPart->bFunc;
    n = Cudd_bddExistAbstract(p->dd,pDVar1,pDVar7);
    pPart->bFunc = n;
    Cudd_Ref(n);
    Cudd_RecursiveDeref(p->dd,pDVar1);
    Cudd_RecursiveDeref(p->dd,pDVar7);
  }
  else {
    pDVar1 = pPart->bFunc;
    pDVar7 = Cudd_LargestCube(p->dd,pDVar1,&Length);
    pPart->bFunc = pDVar7;
    Cudd_Ref(pDVar7);
    printf("Subsetting %3d : ",(ulong)(uint)pPart->iPart);
    uVar2 = Cudd_SupportSize(p->dd,pDVar1);
    uVar3 = Cudd_DagSize(pDVar1);
    printf("(Supp =%3d  Node =%5d) -> ",(ulong)uVar2,(ulong)uVar3);
    uVar2 = Cudd_SupportSize(p->dd,pPart->bFunc);
    uVar3 = Cudd_DagSize(pPart->bFunc);
    printf("(Supp =%3d  Node =%5d)\n",(ulong)uVar2,(ulong)uVar3);
    iVar4 = Cudd_DagSize(pDVar1);
    iVar5 = Cudd_DagSize(pPart->bFunc);
    Cudd_RecursiveDeref(p->dd,pDVar1);
    if (iVar4 == iVar5) {
      return 1;
    }
  }
  iVar5 = 0;
  p_01 = Vec_PtrAlloc(0);
  iVar4 = Cudd_DagSize(pPart->bFunc);
  Extra_SupportArray(p->dd,pPart->bFunc,p->pSupp);
  do {
    p_00 = pPart->vVars;
    if (p_00->nSize <= iVar5) {
      pPart->nSize = iVar4;
      p_00->nSize = 0;
      for (lVar8 = 0; lVar8 < p->nVars; lVar8 = lVar8 + 1) {
        if ((p->pSupp[lVar8] != 0) && (p->pVars2Q[lVar8] != 0)) {
          Vec_IntPush(pPart->vVars,(int)lVar8);
        }
      }
      iVar4 = p_01->nSize;
      iVar5 = 0;
      if (iVar4 < 1) {
        iVar4 = 0;
        iVar5 = 0;
      }
      for (; iVar4 != iVar5; iVar5 = iVar5 + 1) {
        pPart_00 = (Llb_Prt_t *)Vec_PtrEntry(p_01,iVar5);
        Llb_NonlinQuantify1(p,pPart_00,0);
      }
      Vec_PtrFree(p_01);
      return 0;
    }
    iVar6 = Vec_IntEntry(p_00,iVar5);
    pVar = p->pVars[iVar6];
    if (p->pSupp[pVar->iVar] == 0) {
      iVar6 = Vec_IntRemove(pVar->vParts,pPart->iPart);
      if (iVar6 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb3Image.c"
                      ,0x136,"int Llb_NonlinQuantify1(Llb_Mgr_t *, Llb_Prt_t *, int)");
      }
      pVar->nScore = pVar->nScore - pPart->nSize;
      iVar6 = pVar->vParts->nSize;
      if (iVar6 == 1) {
        iVar6 = Vec_IntEntry(pVar->vParts,0);
        Vec_PtrPushUnique(p_01,p->pParts[iVar6]);
      }
      else if (iVar6 == 0) {
        Llb_NonlinRemoveVar(p,pVar);
      }
    }
    else {
      if (pVar->vParts->nSize < 2) {
        __assert_fail("Vec_IntSize(pVar->vParts) > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb3Image.c"
                      ,0x130,"int Llb_NonlinQuantify1(Llb_Mgr_t *, Llb_Prt_t *, int)");
      }
      pVar->nScore = pVar->nScore + (iVar4 - pPart->nSize);
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

int Llb_NonlinQuantify1( Llb_Mgr_t * p, Llb_Prt_t * pPart, int fSubset )
{
    Llb_Var_t * pVar;
    Llb_Prt_t * pTemp;
    Vec_Ptr_t * vSingles;
    DdNode * bCube, * bTemp;
    int i, RetValue, nSizeNew;
    if ( fSubset )
    {        
        int Length;
//        int nSuppSize = Cudd_SupportSize( p->dd, pPart->bFunc );
//        pPart->bFunc = Cudd_SubsetHeavyBranch( p->dd, bTemp = pPart->bFunc, nSuppSize, 3*pPart->nSize/4 );  Cudd_Ref( pPart->bFunc );
        pPart->bFunc = Cudd_LargestCube( p->dd, bTemp = pPart->bFunc, &Length );  Cudd_Ref( pPart->bFunc );

        printf( "Subsetting %3d : ", pPart->iPart );
        printf( "(Supp =%3d  Node =%5d) -> ", Cudd_SupportSize(p->dd, bTemp),        Cudd_DagSize(bTemp) );
        printf( "(Supp =%3d  Node =%5d)\n",   Cudd_SupportSize(p->dd, pPart->bFunc), Cudd_DagSize(pPart->bFunc) );

        RetValue = (Cudd_DagSize(bTemp) == Cudd_DagSize(pPart->bFunc));

        Cudd_RecursiveDeref( p->dd, bTemp );

        if ( RetValue )
            return 1;
    }
    else
    {
        // create cube to be quantified
        bCube = Llb_NonlinCreateCube1( p, pPart );   Cudd_Ref( bCube );
//        assert( !Cudd_IsConstant(bCube) );
        // derive new function
        pPart->bFunc = Cudd_bddExistAbstract( p->dd, bTemp = pPart->bFunc, bCube );  Cudd_Ref( pPart->bFunc );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bCube );
    }
    // get support
    vSingles = Vec_PtrAlloc( 0 );
    nSizeNew = Cudd_DagSize(pPart->bFunc);
    Extra_SupportArray( p->dd, pPart->bFunc, p->pSupp );
    Llb_PartForEachVar( p, pPart, pVar, i )
        if ( p->pSupp[pVar->iVar] )
        {
            assert( Vec_IntSize(pVar->vParts) > 1 );
            pVar->nScore -= pPart->nSize - nSizeNew;
        }
        else
        {
            RetValue = Vec_IntRemove( pVar->vParts, pPart->iPart );
            assert( RetValue );
            pVar->nScore -= pPart->nSize;
            if ( Vec_IntSize(pVar->vParts) == 0 )
                Llb_NonlinRemoveVar( p, pVar );
            else if ( Vec_IntSize(pVar->vParts) == 1 )
                Vec_PtrPushUnique( vSingles, Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0)) );
        }

    // update partition
    pPart->nSize = nSizeNew;
    Vec_IntClear( pPart->vVars );
    for ( i = 0; i < p->nVars; i++ )
        if ( p->pSupp[i] && p->pVars2Q[i] )
            Vec_IntPush( pPart->vVars, i );
    // remove other variables
    Vec_PtrForEachEntry( Llb_Prt_t *, vSingles, pTemp, i )
        Llb_NonlinQuantify1( p, pTemp, 0 );
    Vec_PtrFree( vSingles );
    return 0;
}